

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Gate.cpp
# Opt level: O2

int __thiscall tiles::Gate::init(Gate *this,EVP_PKEY_CTX *ctx)

{
  uint in_ECX;
  uint in_EDX;
  uint in_R8D;
  uint in_R9D;
  
  Chunk::markTileDirty((Chunk *)ctx,in_EDX);
  *(uint *)(ctx + (ulong)in_EDX * 4) =
       (in_R8D & 3) << 0xc |
       (in_R9D & 3) << 8 | *(uint *)(ctx + (ulong)in_EDX * 4) & 0xc0e0 | in_ECX & 0x1f;
  return in_EDX;
}

Assistant:

void Gate::init(Chunk& chunk, unsigned int tileIndex, TileId::t gateId, Direction::t direction, State::t state) {
    auto& tileData = modifyTileData(chunk, tileIndex);
    assert(gateId >= TileId::gateDiode && gateId <= TileId::gateXnor);
    tileData.id = gateId;
    tileData.state1 = state;
    tileData.state2 = State::disconnected;
    tileData.dir = direction;
    tileData.meta = 0;
}